

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_15(QPDF *pdf,char *arg2)

{
  undefined8 *puVar1;
  pointer pQVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char cVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  _IO_FILE *p_Var7;
  ulong uVar8;
  bool bVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_R8;
  pointer pQVar10;
  undefined8 uVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle QVar17;
  QPDFObjectHandle QVar18;
  QPDFObjectHandle QVar19;
  QPDFObjectHandle QVar20;
  QPDFObjectHandle QVar21;
  QPDFObjectHandle QVar22;
  QPDFObjectHandle QVar23;
  QPDFObjectHandle QVar24;
  QPDFObjectHandle QVar25;
  QPDFWriter w;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_pages;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> contents;
  QPDFObjectHandle page;
  QPDFObjectHandle page_template;
  string local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_228;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  QPDFObjectHandle local_1d8;
  QPDFObjectHandle local_1c8;
  QPDFObjectHandle local_1b8;
  QPDFObjectHandle local_1a8;
  QPDFObjectHandle local_198;
  QPDFObjectHandle local_188;
  undefined8 local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  _func_int **local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  _func_int **local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  undefined8 local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  _func_int **local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _func_int **local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _func_int **local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  QPDFObjectHandle local_e8;
  _func_int **local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  QPDFObjectHandle local_68;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38;
  
  plVar4 = (long *)QPDF::getAllPages();
  if (plVar4[1] - *plVar4 != 0xa0) {
    __assert_fail("pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29a,"void test_15(QPDF &, const char *)");
  }
  local_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  cVar3 = QPDF::everPushedInheritedAttributesToPages();
  if (cVar3 != '\0') {
    __assert_fail("!pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29b,"void test_15(QPDF &, const char *)");
  }
  local_48 = *(undefined8 *)(plVar4[1] + -0x10);
  local_40 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar4[1] + -8);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_48;
  QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_230._M_pi;
  QPDF::removePage(QVar12);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  cVar3 = QPDF::everPushedInheritedAttributesToPages();
  if (cVar3 == '\0') {
    __assert_fail("pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29d,"void test_15(QPDF &, const char *)");
  }
  puVar1 = (undefined8 *)*plVar4;
  if (plVar4[1] - (long)puVar1 != 0x90) {
    __assert_fail("pages.size() == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29e,"void test_15(QPDF &, const char *)");
  }
  local_58 = *puVar1;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_58;
  QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_230._M_pi;
  QPDF::removePage(QVar13);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  lVar5 = *plVar4;
  if (plVar4[1] - lVar5 != 0x80) {
    __assert_fail("pages.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2a0,"void test_15(QPDF &, const char *)");
  }
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar5 + 0x40);
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x48);
  if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Original page 5","");
  checkPageContents(&local_68,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  lVar5 = *plVar4;
  uVar8 = plVar4[1] - lVar5 >> 4;
  if (uVar8 < 5) {
    uVar11 = 4;
LAB_00119963:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11,
               uVar8);
LAB_0011996a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0011997c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0011998e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_78 = *(undefined8 *)(lVar5 + 0x40);
    local_70 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x48);
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_70->_M_use_count = local_70->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_70->_M_use_count = local_70->_M_use_count + 1;
      }
    }
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_230._M_pi;
    QPDF::removePage(QVar14);
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    lVar5 = *plVar4;
    if (plVar4[1] - lVar5 != 0x70) {
      __assert_fail("pages.size() == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2a3,"void test_15(QPDF &, const char *)");
    }
    local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = *(element_type **)(lVar5 + 0x40);
    local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x48);
    if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Original page 6","");
    checkPageContents(&local_88,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    puVar1 = (undefined8 *)*plVar4;
    if ((undefined8 *)plVar4[1] == puVar1) {
      uVar11 = 0;
      uVar8 = 0;
      goto LAB_00119963;
    }
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar1;
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Original page 1","");
    checkPageContents(&local_98,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    lVar5 = *plVar4;
    uVar8 = plVar4[1] - lVar5 >> 4;
    if (uVar8 < 7) {
      uVar11 = 6;
      goto LAB_00119963;
    }
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = *(element_type **)(lVar5 + 0x60);
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x68);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Original page 8","");
    checkPageContents(&local_a8,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 1","");
    createPageContents((QPDF *)&local_228,(string *)local_230._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_208,(QPDFObjectHandle *)&local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 0","");
    createPageContents((QPDF *)&local_228,(string *)local_230._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_208,(QPDFObjectHandle *)&local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 5","");
    createPageContents((QPDF *)&local_228,(string *)local_230._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_208,(QPDFObjectHandle *)&local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 6","");
    createPageContents((QPDF *)&local_228,(string *)local_230._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_208,(QPDFObjectHandle *)&local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 11","");
    createPageContents((QPDF *)&local_228,(string *)local_230._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_208,(QPDFObjectHandle *)&local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 12","");
    createPageContents((QPDF *)&local_228,(string *)local_230._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_208,(QPDFObjectHandle *)&local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pQVar2 = local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (undefined8 *)*plVar4;
    if ((undefined8 *)plVar4[1] == puVar1) goto LAB_0011996a;
    local_b8 = *puVar1;
    local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
      }
    }
    local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = plVar4;
    if (local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar9 = true;
      pQVar10 = local_208.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        QPDFObjectHandle::shallowCopy();
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Contents","");
        QPDFObjectHandle::replaceKey((string *)&local_1e8,(QPDFObjectHandle *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (bVar9) {
          bVar9 = false;
        }
        else {
          local_c8 = local_1e8;
          local_c0 = p_Stack_1e0;
          if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_1e0->_M_use_count = p_Stack_1e0->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_1e0->_M_use_count = p_Stack_1e0->_M_use_count + 1;
            }
          }
          QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_230._M_pi;
          QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&local_258;
          QPDF::makeIndirectObject(QVar15);
          this = p_Stack_1e0;
          p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length;
          local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p;
          local_258._M_dataplus._M_p = (pointer)0x0;
          local_258._M_string_length = 0;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length);
          }
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  (&local_228,(value_type *)&local_1e8);
        if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
        }
        pQVar10 = pQVar10 + 1;
      } while (pQVar10 != pQVar2);
    }
    plVar4 = local_38;
    if (local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_00119878:
      uVar11 = 0;
      uVar8 = 0;
LAB_00119b44:
      uVar11 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,uVar11,uVar8);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_228);
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_208);
      _Unwind_Resume(uVar11);
    }
    local_d8 = *(_func_int ***)
                &(local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle;
    local_d0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)local_228.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start + 8);
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
      }
    }
    QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_d8;
    QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_230._M_pi;
    QPDF::addPage(QVar16,true);
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    puVar1 = (undefined8 *)*plVar4;
    if ((undefined8 *)plVar4[1] == puVar1) goto LAB_00119878;
    local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar1;
    local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_e8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_e8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"New page 1","");
    checkPageContents(&local_e8,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    uVar8 = (long)local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    uVar11 = 1;
    if (uVar8 < 2) goto LAB_00119b44;
    local_f8 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
    local_f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_f0->_M_use_count = local_f0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_f0->_M_use_count = local_f0->_M_use_count + 1;
      }
    }
    puVar1 = (undefined8 *)*plVar4;
    if ((undefined8 *)plVar4[1] == puVar1) goto LAB_0011997c;
    local_108 = *puVar1;
    local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_100->_M_use_count = local_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_100->_M_use_count = local_100->_M_use_count + 1;
      }
    }
    QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_f8;
    QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_230._M_pi;
    QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_R8._M_pi;
    QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_108;
    QPDF::addPageAt(QVar17,true,QVar22);
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    if (plVar4[1] == *plVar4) goto LAB_0011998e;
    lVar5 = QPDFObjectHandle::getObjGen();
    if (1 < (ulong)((long)local_228.
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_228.
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4)) {
      lVar6 = QPDFObjectHandle::getObjGen();
      if (lVar5 != lVar6) goto LAB_001199b3;
      uVar8 = (long)local_228.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_228.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      if (uVar8 < 3) {
        uVar11 = 2;
        goto LAB_00119b44;
      }
      local_118 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (local_228.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2))->_vptr__Sp_counted_base;
      local_110 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (local_228.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_start + 2))->_M_use_count;
      if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_110->_M_use_count = local_110->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_110->_M_use_count = local_110->_M_use_count + 1;
        }
      }
      lVar5 = *plVar4;
      if ((ulong)(plVar4[1] - lVar5 >> 4) < 6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
LAB_001199f0:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
      }
      else {
        local_128 = *(undefined8 *)(lVar5 + 0x50);
        local_120 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x58);
        if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_120->_M_use_count = local_120->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_120->_M_use_count = local_120->_M_use_count + 1;
          }
        }
        QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_118;
        QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_230._M_pi;
        QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = in_R8._M_pi;
        QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_128;
        QPDF::addPageAt(QVar18,true,QVar23);
        if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
        }
        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
        }
        if ((ulong)(plVar4[1] - *plVar4 >> 4) < 6) goto LAB_001199f0;
        lVar5 = QPDFObjectHandle::getObjGen();
        if (2 < (ulong)((long)local_228.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_228.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          lVar6 = QPDFObjectHandle::getObjGen();
          if (lVar5 != lVar6) goto LAB_00119a16;
          uVar8 = (long)local_228.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_228.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4;
          if (uVar8 < 4) {
            uVar11 = 3;
            goto LAB_00119b44;
          }
          local_138 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_228.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start + 3))->_vptr__Sp_counted_base;
          local_130 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (local_228.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start + 3))->_M_use_count;
          if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_130->_M_use_count = local_130->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_130->_M_use_count = local_130->_M_use_count + 1;
            }
          }
          lVar5 = *plVar4;
          if ((ulong)(plVar4[1] - lVar5 >> 4) < 6) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5
                      );
LAB_00119a53:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",6
                      );
          }
          else {
            local_148 = *(undefined8 *)(lVar5 + 0x50);
            local_140 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x58);
            if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_140->_M_use_count = local_140->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_140->_M_use_count = local_140->_M_use_count + 1;
              }
            }
            QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_138;
            QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_230._M_pi;
            QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = in_R8._M_pi;
            QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_148;
            QPDF::addPageAt(QVar19,false,QVar24);
            if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
            }
            if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
            }
            if ((ulong)(plVar4[1] - *plVar4 >> 4) < 7) goto LAB_00119a53;
            lVar5 = QPDFObjectHandle::getObjGen();
            if (3 < (ulong)((long)local_228.
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_228.
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
              lVar6 = QPDFObjectHandle::getObjGen();
              if (lVar5 != lVar6) goto LAB_00119a79;
              if (plVar4[1] - *plVar4 != 0xb0) {
                __assert_fail("pages.size() == 11",
                              "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                              ,0x2d1,"void test_15(QPDF &, const char *)");
              }
              uVar8 = (long)local_228.
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_228.
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 4;
              if (4 < uVar8) {
                local_158 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_228.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4))->_vptr__Sp_counted_base
                ;
                local_150 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (local_228.
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4))->_M_use_count;
                if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_150->_M_use_count = local_150->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_150->_M_use_count = local_150->_M_use_count + 1;
                  }
                }
                QVar20.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_158;
                QVar20.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)local_230._M_pi;
                QPDF::addPage(QVar20,false);
                if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
                }
                if ((ulong)(plVar4[1] - *plVar4 >> 4) < 0xc) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0xb);
                }
                else {
                  lVar5 = QPDFObjectHandle::getObjGen();
                  if (4 < (ulong)((long)local_228.
                                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_228.
                                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
                    lVar6 = QPDFObjectHandle::getObjGen();
                    if (lVar5 == lVar6) {
                      uVar8 = (long)local_228.
                                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.
                                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4;
                      if (uVar8 < 6) {
                        uVar11 = 5;
                      }
                      else {
                        local_168 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    (local_228.
                                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 5))->
                                    _vptr__Sp_counted_base;
                        local_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (local_228.
                                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 5))->_M_use_count
                        ;
                        if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_160->_M_use_count = local_160->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_160->_M_use_count = local_160->_M_use_count + 1;
                          }
                        }
                        local_178 = *(undefined8 *)(plVar4[1] + -0x10);
                        local_170 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                     (plVar4[1] + -8);
                        if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_170->_M_use_count = local_170->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_170->_M_use_count = local_170->_M_use_count + 1;
                          }
                        }
                        QVar21.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_168;
                        QVar21.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)local_230._M_pi;
                        QVar25.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                             = in_R8._M_pi;
                        QVar25.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)&local_178;
                        QPDF::addPageAt(QVar21,false,QVar25);
                        if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
                        }
                        if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
                        }
                        puVar1 = (undefined8 *)*plVar4;
                        if (plVar4[1] - (long)puVar1 != 0xd0) {
                          __assert_fail("pages.size() == 13",
                                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                                        ,0x2d5,"void test_15(QPDF &, const char *)");
                        }
                        local_188.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)*puVar1;
                        local_188.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
                        if (local_188.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (local_188.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_M_use_count =
                                 (local_188.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (local_188.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_M_use_count =
                                 (local_188.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                          }
                        }
                        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_258,"New page 0","");
                        checkPageContents(&local_188,&local_258);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_258._M_dataplus._M_p != &local_258.field_2) {
                          operator_delete(local_258._M_dataplus._M_p,
                                          local_258.field_2._M_allocated_capacity + 1);
                        }
                        if (local_188.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_188.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
                        }
                        lVar5 = *plVar4;
                        uVar8 = plVar4[1] - lVar5 >> 4;
                        if (1 < uVar8) {
                          local_198.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                               *(element_type **)(lVar5 + 0x10);
                          local_198.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x18);
                          if (local_198.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              (local_198.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count =
                                   (local_198.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              (local_198.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count =
                                   (local_198.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                            }
                          }
                          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_258,"New page 1","");
                          checkPageContents(&local_198,&local_258);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_258._M_dataplus._M_p != &local_258.field_2) {
                            operator_delete(local_258._M_dataplus._M_p,
                                            local_258.field_2._M_allocated_capacity + 1);
                          }
                          if (local_198.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_198.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi);
                          }
                          lVar5 = *plVar4;
                          uVar8 = plVar4[1] - lVar5 >> 4;
                          uVar11 = 5;
                          if (5 < uVar8) {
                            local_1a8.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                                 *(element_type **)(lVar5 + 0x50);
                            local_1a8.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x58)
                            ;
                            if (local_1a8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (local_1a8.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (local_1a8.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (local_1a8.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (local_1a8.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_258,"New page 5","");
                            checkPageContents(&local_1a8,&local_258);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
                              operator_delete(local_258._M_dataplus._M_p,
                                              local_258.field_2._M_allocated_capacity + 1);
                            }
                            if (local_1a8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_1a8.super_BaseHandle.obj.
                                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_refcount._M_pi);
                            }
                            lVar5 = *plVar4;
                            uVar8 = plVar4[1] - lVar5 >> 4;
                            if (uVar8 < 7) {
                              uVar11 = 6;
                            }
                            else {
                              local_1b8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                                   *(element_type **)(lVar5 + 0x60);
                              local_1b8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        (lVar5 + 0x68);
                              if (local_1b8.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_1b8.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count =
                                       (local_1b8.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_1b8.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count =
                                       (local_1b8.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_258,"New page 6","");
                              checkPageContents(&local_1b8,&local_258);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                                operator_delete(local_258._M_dataplus._M_p,
                                                local_258.field_2._M_allocated_capacity + 1);
                              }
                              if (local_1b8.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_1b8.super_BaseHandle.obj.
                                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              lVar5 = *plVar4;
                              uVar8 = plVar4[1] - lVar5 >> 4;
                              if (uVar8 < 0xc) {
                                uVar11 = 0xb;
                              }
                              else {
                                local_1c8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                                     *(element_type **)(lVar5 + 0xb0);
                                local_1c8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                      (lVar5 + 0xb8);
                                if (local_1c8.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_1c8.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi)->_M_use_count =
                                         (local_1c8.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_1c8.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi)->_M_use_count =
                                         (local_1c8.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_258,"New page 11","");
                                checkPageContents(&local_1c8,&local_258);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                                  operator_delete(local_258._M_dataplus._M_p,
                                                  local_258.field_2._M_allocated_capacity + 1);
                                }
                                if (local_1c8.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_1c8.super_BaseHandle.obj.
                                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                lVar5 = *plVar4;
                                uVar8 = plVar4[1] - lVar5 >> 4;
                                if (0xc < uVar8) {
                                  local_1d8.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                       = *(element_type **)(lVar5 + 0xc0);
                                  local_1d8.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi =
                                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        (lVar5 + 200);
                                  if (local_1d8.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      (local_1d8.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi)->_M_use_count =
                                           (local_1d8.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      (local_1d8.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi)->_M_use_count =
                                           (local_1d8.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                    }
                                  }
                                  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_258,"New page 12","");
                                  checkPageContents(&local_1d8,&local_258);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                                    operator_delete(local_258._M_dataplus._M_p,
                                                    local_258.field_2._M_allocated_capacity + 1);
                                  }
                                  if (local_1d8.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_1d8.super_BaseHandle.obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
                                  }
                                  p_Var7 = (_IO_FILE *)QUtil::safe_fopen("a.pdf","wb");
                                  QPDFWriter::QPDFWriter
                                            ((QPDFWriter *)&local_258,(QPDF *)local_230._M_pi,
                                             "FILE* a.pdf",p_Var7,true);
                                  QPDFWriter::setStaticID(SUB81(&local_258,0));
                                  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_258);
                                  QPDFWriter::write();
                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      local_258._M_string_length !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                               local_258._M_string_length);
                                  }
                                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                                  ~vector(&local_228);
                                  if (local_b0 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_b0);
                                  }
                                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                                  ~vector(&local_208);
                                  return;
                                }
                                uVar11 = 0xc;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00119b44;
                    }
                    goto LAB_00119ae8;
                  }
                }
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,4);
LAB_00119ae8:
                __assert_fail("pages.at(11).getObjGen() == new_pages.at(4).getObjGen()",
                              "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                              ,0x2d3,"void test_15(QPDF &, const char *)");
              }
              uVar11 = 4;
              goto LAB_00119b44;
            }
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
LAB_00119a79:
          __assert_fail("pages.at(6).getObjGen() == new_pages.at(3).getObjGen()",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x2d0,"void test_15(QPDF &, const char *)");
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_00119a16:
      __assert_fail("pages.at(5).getObjGen() == new_pages.at(2).getObjGen()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2ce,"void test_15(QPDF &, const char *)");
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_001199b3:
  __assert_fail("pages.at(0).getObjGen() == new_pages.at(1).getObjGen()",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x2cc,"void test_15(QPDF &, const char *)");
}

Assistant:

static void
test_15(QPDF& pdf, char const* arg2)
{
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    // Reference to original page numbers for this test case are
    // numbered from 0.

    // Remove pages from various places, checking to make sure
    // that our pages reference is getting updated.
    assert(pages.size() == 10);
    assert(!pdf.everPushedInheritedAttributesToPages());
    pdf.removePage(pages.back()); // original page 9
    assert(pdf.everPushedInheritedAttributesToPages());
    assert(pages.size() == 9);
    pdf.removePage(*pages.begin()); // original page 0
    assert(pages.size() == 8);
    checkPageContents(pages.at(4), "Original page 5");
    pdf.removePage(pages.at(4)); // original page 5
    assert(pages.size() == 7);
    checkPageContents(pages.at(4), "Original page 6");
    checkPageContents(pages.at(0), "Original page 1");
    checkPageContents(pages.at(6), "Original page 8");

    // Insert pages

    // Create some content streams.
    std::vector<QPDFObjectHandle> contents;
    contents.push_back(createPageContents(pdf, "New page 1"));
    contents.push_back(createPageContents(pdf, "New page 0"));
    contents.push_back(createPageContents(pdf, "New page 5"));
    contents.push_back(createPageContents(pdf, "New page 6"));
    contents.push_back(createPageContents(pdf, "New page 11"));
    contents.push_back(createPageContents(pdf, "New page 12"));

    // Create some page objects.  Start with an existing
    // dictionary and modify it.  Using the results of
    // getDictAsMap to create a new dictionary effectively creates
    // a shallow copy.
    QPDFObjectHandle page_template = pages.at(0);
    std::vector<QPDFObjectHandle> new_pages;
    bool first = true;
    for (auto const& iter: contents) {
        // We will retain indirect object references to other
        // indirect objects other than page content.
        QPDFObjectHandle page = page_template.shallowCopy();
        page.replaceKey("/Contents", iter);
        if (first) {
            // leave direct
            first = false;
        } else {
            page = pdf.makeIndirectObject(page);
        }
        new_pages.push_back(page);
    }

    // Now insert the pages
    pdf.addPage(new_pages.at(0), true);
    checkPageContents(pages.at(0), "New page 1");
    pdf.addPageAt(new_pages.at(1), true, pages.at(0));
    assert(pages.at(0).getObjGen() == new_pages.at(1).getObjGen());
    pdf.addPageAt(new_pages.at(2), true, pages.at(5));
    assert(pages.at(5).getObjGen() == new_pages.at(2).getObjGen());
    pdf.addPageAt(new_pages.at(3), false, pages.at(5));
    assert(pages.at(6).getObjGen() == new_pages.at(3).getObjGen());
    assert(pages.size() == 11);
    pdf.addPage(new_pages.at(4), false);
    assert(pages.at(11).getObjGen() == new_pages.at(4).getObjGen());
    pdf.addPageAt(new_pages.at(5), false, pages.back());
    assert(pages.size() == 13);
    checkPageContents(pages.at(0), "New page 0");
    checkPageContents(pages.at(1), "New page 1");
    checkPageContents(pages.at(5), "New page 5");
    checkPageContents(pages.at(6), "New page 6");
    checkPageContents(pages.at(11), "New page 11");
    checkPageContents(pages.at(12), "New page 12");

    // Exercise writing to FILE*
    FILE* out = QUtil::safe_fopen("a.pdf", "wb");
    QPDFWriter w(pdf, "FILE* a.pdf", out, true);
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}